

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O1

_Bool history_add(player *p,char *text,wchar_t type)

{
  bitflag flags [2];
  bitflag local_22 [2];
  
  flag_wipe(local_22,2);
  flag_on_dbg(local_22,2,type,"flags","type");
  history_add_full(p,local_22,L'\0',(int)p->place,(int)p->lev,p->total_energy / 100,text);
  return true;
}

Assistant:

bool history_add(struct player *p, const char *text, int type)
{
	bitflag flags[HIST_SIZE];
	hist_wipe(flags);
	hist_on(flags, type);

	return history_add_with_flags(p, text, flags, NULL);
}